

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O1

bool __thiscall wallet::CWallet::UpgradeWallet(CWallet *this,int version,bilingual_str *error)

{
  bool bVar1;
  char cVar2;
  WalletFeature nVersion;
  undefined8 uVar3;
  int *in_R8;
  WalletFeature *in_R9;
  long in_FS_OFFSET;
  int prev_version;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock61;
  undefined1 local_d0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  _Alloc_hider local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  bilingual_str local_70;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_d0._4_4_ = version;
  local_d0._0_4_ = GetVersion(this);
  if (local_d0._4_4_ == 0) {
    local_70.original._M_dataplus._M_p._0_4_ = 0x297ac;
    WalletLogPrintf<wallet::WalletFeature>
              (this,(ConstevalFormatString<1U>)0x4946ce,(WalletFeature *)&local_70);
    local_d0._4_4_ = 0x297ac;
  }
  else {
    WalletLogPrintf<int>(this,(ConstevalFormatString<1U>)0x4946ef,(int *)(local_d0 + 4));
  }
  if ((int)local_d0._4_4_ < (int)local_d0._0_4_) {
    local_b0._M_p = (pointer)&local_a0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,
               "Cannot downgrade wallet from version %i to version %i. Wallet version unchanged.",""
              );
    if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_90,
                 "Cannot downgrade wallet from version %i to version %i. Wallet version unchanged.",
                 "");
    }
    else {
      local_c0._M_allocated_capacity = 0x494711;
      (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                (&local_90,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,
                 (char **)&local_c0._M_allocated_capacity);
    }
    tinyformat::format<int,int>
              (&local_70,(tinyformat *)&local_b0,(bilingual_str *)local_d0,(int *)(local_d0 + 4),
               in_R8);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&error->original,&local_70.original);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&error->translated,&local_70.translated);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70.translated._M_dataplus._M_p != &local_70.translated.field_2) {
      operator_delete(local_70.translated._M_dataplus._M_p,
                      local_70.translated.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_70.original._M_dataplus._M_p._4_4_,
                    local_70.original._M_dataplus._M_p._0_4_) != &local_70.original.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_70.original._M_dataplus._M_p._4_4_,
                               local_70.original._M_dataplus._M_p._0_4_),
                      local_70.original.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_p != &local_a0) {
      operator_delete(local_b0._M_p,local_a0._M_allocated_capacity + 1);
    }
    bVar1 = false;
  }
  else {
    local_c0._M_allocated_capacity = (size_type)&this->cs_wallet;
    local_c0._M_local_buf[8] = '\0';
    std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)&local_c0);
    bVar1 = IsFeatureSupported(this->nWalletVersion,0x2227c);
    if (bVar1 || local_d0._4_4_ - 0x297ac < 0xffff8ad0) {
      nVersion = GetClosestWalletFeature(local_d0._4_4_);
      SetMinVersion(this,nVersion,(WalletBatch *)0x0);
      GetActiveScriptPubKeyMans
                ((set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
                  *)&local_70,this);
      for (uVar3 = local_70.original.field_2._8_8_;
          bVar1 = (size_type *)uVar3 == &local_70.original._M_string_length, !bVar1;
          uVar3 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar3)) {
        cVar2 = (**(code **)(**(long **)(uVar3 + 0x20) + 0x70))
                          (*(long **)(uVar3 + 0x20),local_d0._0_4_,local_d0._4_4_,error);
        if (cVar2 == '\0') break;
      }
      std::
      _Rb_tree<wallet::ScriptPubKeyMan_*,_wallet::ScriptPubKeyMan_*,_std::_Identity<wallet::ScriptPubKeyMan_*>,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
      ::~_Rb_tree((_Rb_tree<wallet::ScriptPubKeyMan_*,_wallet::ScriptPubKeyMan_*,_std::_Identity<wallet::ScriptPubKeyMan_*>,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
                   *)&local_70);
    }
    else {
      local_b0._M_p = (pointer)&local_a0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b0,
                 "Cannot upgrade a non HD split wallet from version %i to version %i without upgrading to support pre-split keypool. Please use version %i or no version specified."
                 ,"");
      if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_90,
                   "Cannot upgrade a non HD split wallet from version %i to version %i without upgrading to support pre-split keypool. Please use version %i or no version specified."
                   ,"");
      }
      else {
        local_d0._8_8_ =
             "Cannot upgrade a non HD split wallet from version %i to version %i without upgrading to support pre-split keypool. Please use version %i or no version specified."
        ;
        (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                  (&local_90,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)(local_d0 + 8));
      }
      local_d0._8_4_ = 0x297ac;
      tinyformat::format<int,int,wallet::WalletFeature>
                (&local_70,(tinyformat *)&local_b0,(bilingual_str *)local_d0,(int *)(local_d0 + 4),
                 (int *)(local_d0 + 8),in_R9);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&error->original,&local_70.original);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&error->translated,&local_70.translated);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70.translated._M_dataplus._M_p != &local_70.translated.field_2) {
        operator_delete(local_70.translated._M_dataplus._M_p,
                        local_70.translated.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_70.original._M_dataplus._M_p._4_4_,
                      local_70.original._M_dataplus._M_p._0_4_) != &local_70.original.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_70.original._M_dataplus._M_p._4_4_,
                                 local_70.original._M_dataplus._M_p._0_4_),
                        local_70.original.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_p != &local_a0) {
        operator_delete(local_b0._M_p,local_a0._M_allocated_capacity + 1);
      }
      bVar1 = false;
    }
    std::unique_lock<std::recursive_mutex>::~unique_lock
              ((unique_lock<std::recursive_mutex> *)&local_c0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool CWallet::UpgradeWallet(int version, bilingual_str& error)
{
    int prev_version = GetVersion();
    if (version == 0) {
        WalletLogPrintf("Performing wallet upgrade to %i\n", FEATURE_LATEST);
        version = FEATURE_LATEST;
    } else {
        WalletLogPrintf("Allowing wallet upgrade up to %i\n", version);
    }
    if (version < prev_version) {
        error = strprintf(_("Cannot downgrade wallet from version %i to version %i. Wallet version unchanged."), prev_version, version);
        return false;
    }

    LOCK(cs_wallet);

    // Do not upgrade versions to any version between HD_SPLIT and FEATURE_PRE_SPLIT_KEYPOOL unless already supporting HD_SPLIT
    if (!CanSupportFeature(FEATURE_HD_SPLIT) && version >= FEATURE_HD_SPLIT && version < FEATURE_PRE_SPLIT_KEYPOOL) {
        error = strprintf(_("Cannot upgrade a non HD split wallet from version %i to version %i without upgrading to support pre-split keypool. Please use version %i or no version specified."), prev_version, version, FEATURE_PRE_SPLIT_KEYPOOL);
        return false;
    }

    // Permanently upgrade to the version
    SetMinVersion(GetClosestWalletFeature(version));

    for (auto spk_man : GetActiveScriptPubKeyMans()) {
        if (!spk_man->Upgrade(prev_version, version, error)) {
            return false;
        }
    }
    return true;
}